

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EnvironmentVariableReporter.cpp
# Opt level: O3

bool __thiscall
ApprovalTests::EnvironmentVariableReporter::report
          (EnvironmentVariableReporter *this,string *received,string *approved)

{
  bool bVar1;
  undefined1 auVar2 [16];
  string envVar;
  string envVarName;
  string local_70;
  SystemUtils *local_50;
  pointer local_48;
  pointer local_40 [2];
  
  local_70._M_dataplus._M_p = (pointer)0x1b;
  local_50 = (SystemUtils *)local_40;
  auVar2 = ::std::__cxx11::string::_M_create((ulong *)&local_50,(ulong)&local_70);
  local_50 = auVar2._0_8_;
  local_40[0] = local_70._M_dataplus._M_p;
  *(undefined8 *)(local_50 + 0xb) = 0x5f4553555f535453;
  *(undefined8 *)(local_50 + 0x13) = 0x524554524f504552;
  *(undefined8 *)local_50 = 0x4c41564f52505041;
  *(undefined8 *)(local_50 + 8) = 0x555f53545345545f;
  local_48 = local_70._M_dataplus._M_p;
  local_50[(long)local_70._M_dataplus._M_p] = (SystemUtils)0x0;
  SystemUtils::safeGetEnv_abi_cxx11_(&local_70,local_50,auVar2._8_8_);
  bVar1 = report(this,&local_70,received,approved);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  if (local_50 != (SystemUtils *)local_40) {
    operator_delete(local_50);
  }
  return bVar1;
}

Assistant:

bool EnvironmentVariableReporter::report(std::string received,
                                             std::string approved) const
    {
        // Get the env var
        const auto envVarName = environmentVariableName();
        const auto envVar = SystemUtils::safeGetEnv(envVarName.c_str());
        return report(envVar, received, approved);
    }